

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>
::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,
          Column_settings *colSettings)

{
  ID_index IVar1;
  pointer puVar2;
  pointer puVar3;
  ID_index *pIVar4;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
  *__v;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
  *this_00;
  size_type new_size;
  int iVar5;
  ulong uVar6;
  ID_index *pIVar7;
  ID_index local_44;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>
  *local_40;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
  *local_38;
  
  *(undefined4 *)this = 0xffffffff;
  *(undefined8 *)(this + 8) = 0;
  puVar2 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  new_size = (long)puVar2 - (long)puVar3 >> 2;
  iVar5 = (int)new_size + -1;
  if (puVar2 == puVar3) {
    iVar5 = 0;
  }
  *(int *)(this + 0x10) = iVar5;
  local_38 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
              *)0x0;
  local_40 = this + 0x30;
  *(Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>
    **)(this + 0x18) = local_40;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 8;
  boost::container::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::new_allocator<void>,void>,void>
  ::
  priv_resize<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*>
            ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::new_allocator<void>,void>,void>
              *)(this + 0x18),new_size,&local_38);
  *(undefined8 *)(this + 0x70) = 0;
  *(Column_settings **)(this + 0x78) = colSettings;
  pIVar7 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar4 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar4) {
    uVar6 = 0;
    do {
      IVar1 = *pIVar7;
      __v = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
             *)operator_new(8);
      (__v->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
      __v->rowIndex_ = IVar1;
      if (*(ulong *)(this + 0x20) <= uVar6) {
        __assert_fail("this->m_holder.m_size > n","/usr/include/boost/container/vector.hpp",0x644,
                      "reference boost::container::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, boost::container::new_allocator<void>, void>>::operator[](size_type) [T = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, A = boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, boost::container::new_allocator<void>, void>, Options = void]"
                     );
      }
      *(Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
        **)(*(long *)(this + 0x18) + uVar6 * 8) = __v;
      local_44 = IVar1;
      if (*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
            **)(this + 8) !=
          (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
           *)0x0) {
        this_00 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
                   *)std::
                     map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
                     ::operator[](*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
                                    **)(this + 8),&local_44);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
        ::
        _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>const&>
                  (this_00,__v);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar4);
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(const Container& nonZeroRowIndices,
                                                               Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt(),
      column_(nonZeroRowIndices.size(), nullptr),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, i++);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, i++);
    }
  }
}